

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> __thiscall
QAbstractFileEngine::create(QAbstractFileEngine *this,QString *fileName)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  QArrayDataPointer<char16_t> local_b0;
  undefined1 local_98 [16];
  qsizetype local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined1 local_58 [56];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_58,fileName);
  local_98._8_8_ = (char16_t *)0x0;
  local_88 = -1;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0xfffffffefffffffe;
  this->_vptr_QAbstractFileEngine = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEngine *)this,(QFileSystemEntry *)local_58,
             (QFileSystemMetaData *)(local_98 + 8));
  if (this->_vptr_QAbstractFileEngine == (_func_int **)0x0) {
    QFileSystemEntry::filePath((QString *)&local_b0,(QFileSystemEntry *)local_58);
    std::make_unique<QFSFileEngine,QString>((QString *)local_98);
    uVar2 = local_98._0_8_;
    local_98._0_8_ = (Data *)0x0;
    pp_Var1 = this->_vptr_QAbstractFileEngine;
    this->_vptr_QAbstractFileEngine = (_func_int **)uVar2;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
      if ((Data *)local_98._0_8_ != (Data *)0x0) {
        (**(code **)(*(long *)(QArrayData *)local_98._0_8_ + 8))();
      }
    }
    local_98._0_8_ = (Data *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  }
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
            )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<QAbstractFileEngine> QAbstractFileEngine::create(const QString &fileName)
{
    QFileSystemEntry entry(fileName);
    QFileSystemMetaData metaData;
    auto engine = QFileSystemEngine::createLegacyEngine(entry, metaData);

#ifndef QT_NO_FSFILEENGINE
    if (!engine) // fall back to regular file engine
        engine = std::make_unique<QFSFileEngine>(entry.filePath());
#endif

    return engine;
}